

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer pcVar2;
  string *psVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  ImageProvider *this;
  long lVar10;
  ulong uVar11;
  logic_error *plVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  string *filter_00;
  string *color_space_00;
  long lVar18;
  ulong uVar19;
  QPDFObjectHandle QVar20;
  Pl_Buffer b_p;
  QPDF pdf;
  string desired_color_space;
  QPDF pdf_1;
  string desired_filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filters;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  color_spaces;
  shared_ptr<Buffer> actual_data;
  QPDFObjectHandle image;
  QPDFObjectHandle font;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  QPDFObjectHandle filter;
  QPDFObjectHandle color_space;
  QPDFObjectHandle image_dict;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  images;
  string local_228;
  QPDF local_1f0 [8];
  string local_1e8;
  QPDF local_1c8 [8];
  long *local_1c0;
  char *local_1b8;
  long local_1b0 [2];
  string *local_1a0;
  Buffer *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  ulong local_150;
  undefined1 local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  undefined8 local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  QPDFObjectHandle local_128;
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  ImageProvider *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  string local_f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  string local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  string *local_d8;
  ulong local_d0;
  QPDFWriter local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  char local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  string *local_98;
  string *local_90;
  QPDFPageDocumentHelper local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_60 [24];
  long local_48;
  long local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 2) {
    pcVar1 = argv[1];
    QPDF::QPDF(local_1f0);
    QPDF::emptyPDF();
    operator____qpdf(local_b8,0x1091ac);
    QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0;
    QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_118;
    QPDF::makeIndirectObject(QVar20);
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (char (*) [12])"/DeviceCMYK");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (char (*) [11])"/DeviceRGB");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (char (*) [12])"/DeviceGray");
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
               (char (*) [5])"null");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
               (char (*) [11])"/DCTDecode");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[17]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
               (char (*) [17])"/RunLengthDecode");
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_80,local_1f0);
    local_1a0 = local_168.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      filter_00 = local_188.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      psVar3 = local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      color_space_00 =
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      do {
        for (; filter_00 != psVar3; filter_00 = filter_00 + 1) {
          local_128.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_118;
          local_128.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_110;
          if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_110->_M_use_count = local_110->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_110->_M_use_count = local_110->_M_use_count + 1;
            }
          }
          add_page(&local_80,&local_128,color_space_00,filter_00);
          if (local_128.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        color_space_00 = color_space_00 + 1;
        filter_00 = local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (color_space_00 != local_1a0);
    }
    QPDFWriter::QPDFWriter(local_c8,local_1f0,pcVar1);
    QPDFWriter::write();
    lVar16 = (long)local_168.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_168.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    lVar18 = (long)local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    QPDF::QPDF(local_1c8);
    QPDF::processFile((char *)local_1c8,pcVar1);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_228,local_1c8);
    QPDFPageDocumentHelper::getAllPages();
    uVar17 = lVar16 >> 5;
    uVar19 = lVar18 >> 5;
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_228);
    local_d0 = uVar19;
    if (uVar19 * uVar17 + ((long)local_90 - (long)local_98 >> 3) * -0x6db6db6db6db6db7 == 0) {
      if (local_98 != local_90) {
        local_d8 = local_90;
        lVar16 = 1;
        bVar6 = false;
        local_150 = uVar17;
        do {
          local_1a0 = local_98;
          QPDFPageObjectHelper::getImages_abi_cxx11_();
          if (local_38 != 1) {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar12,"incorrect number of images on page");
            __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          uVar19 = (lVar16 - 1U) / uVar17;
          pcVar2 = local_168.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_dataplus._M_p;
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,pcVar2,
                     pcVar2 + local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_string_length);
          uVar19 = (lVar16 - 1U) % local_d0;
          local_1c0 = local_1b0;
          pcVar2 = local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c0,pcVar2,
                     pcVar2 + local_188.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_string_length);
          iVar7 = std::__cxx11::string::compare((char *)&local_1c0);
          if (iVar7 == 0) {
            std::__cxx11::string::_M_replace((ulong)&local_1c0,0,local_1b8,0x109263);
          }
          local_138 = *(undefined8 *)(local_48 + 0x40);
          local_130 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_48 + 0x48);
          if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_130->_M_use_count = local_130->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_130->_M_use_count = local_130->_M_use_count + 1;
            }
          }
          QPDFObjectHandle::getDict();
          local_228.field_2._M_allocated_capacity._0_4_ = 0x6c6f432f;
          local_228.field_2._M_local_buf[4] = 'o';
          local_228.field_2._M_allocated_capacity._5_2_ = 0x5372;
          local_228.field_2._7_4_ = 0x65636170;
          local_228._M_string_length = 0xb;
          local_228.field_2._M_local_buf[0xb] = '\0';
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          QPDFObjectHandle::getKey(local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,
                            CONCAT17(local_228.field_2._M_local_buf[7],
                                     CONCAT25(local_228.field_2._M_allocated_capacity._5_2_,
                                              CONCAT14(local_228.field_2._M_local_buf[4],
                                                       local_228.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_228.field_2._M_local_buf[4] = 't';
          local_228.field_2._M_allocated_capacity._5_2_ = 0x7265;
          local_228.field_2._M_allocated_capacity._0_4_ = 0x6c69462f;
          local_228._M_string_length = 7;
          local_228.field_2._7_4_ = local_228.field_2._7_4_ & 0xffffff00;
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          QPDFObjectHandle::getKey(local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,
                            CONCAT17(local_228.field_2._M_local_buf[7],
                                     CONCAT25(local_228.field_2._M_allocated_capacity._5_2_,
                                              CONCAT14(local_228.field_2._M_local_buf[4],
                                                       local_228.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          cVar4 = QPDFObjectHandle::isNameAndEquals(local_f8);
          if (cVar4 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"page ",5);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,": expected filter ",0x12);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(char *)local_1c0,(long)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; actual filter = ",0x12);
            QPDFObjectHandle::unparse_abi_cxx11_();
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_228._M_dataplus._M_p,local_228._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,
                              CONCAT17(local_228.field_2._M_local_buf[7],
                                       CONCAT25(local_228.field_2._M_allocated_capacity._5_2_,
                                                CONCAT14(local_228.field_2._M_local_buf[4],
                                                         local_228.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
            }
            bVar6 = true;
          }
          cVar5 = QPDFObjectHandle::isNameAndEquals(local_e8);
          if (cVar5 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"page ",5);
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,": expected color space ",0x17);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"; actual color space = ",0x17);
            QPDFObjectHandle::unparse_abi_cxx11_();
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_228._M_dataplus._M_p,local_228._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,
                              CONCAT17(local_228.field_2._M_local_buf[7],
                                       CONCAT25(local_228.field_2._M_allocated_capacity._5_2_,
                                                CONCAT14(local_228.field_2._M_local_buf[4],
                                                         local_228.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
            }
            bVar6 = true;
          }
          else if (cVar4 != '\0') {
            QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_148);
            this = (ImageProvider *)operator_new(0x88);
            local_228.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
            local_228._M_string_length = 4;
            local_228.field_2._M_local_buf[4] = '\0';
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            ImageProvider::ImageProvider(this,&local_1e8,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,
                              CONCAT17(local_228.field_2._M_local_buf[7],
                                       CONCAT25(local_228.field_2._M_allocated_capacity._5_2_,
                                                CONCAT14(local_228.field_2._M_local_buf[4],
                                                         local_228.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
            }
            local_108 = this;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ImageProvider*>
                      (&local_100,this);
            Pl_Buffer::Pl_Buffer((Pl_Buffer *)&local_228,"get image data",(Pipeline *)0x0);
            local_198 = (Buffer *)0x0;
            (**(code **)(*(long *)local_108 + 0x10))(local_108,&local_198,&local_228);
            local_198 = (Buffer *)Pl_Buffer::getBuffer();
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Buffer*>
                      (&local_190,local_198);
            lVar18 = Buffer::getSize();
            lVar10 = Buffer::getSize();
            if (lVar18 == lVar10) {
              lVar18 = Buffer::getBuffer();
              lVar10 = Buffer::getBuffer();
              uVar19 = Buffer::getSize();
              iVar8 = std::__cxx11::string::compare((char *)&local_1c0);
              iVar7 = 0;
              if (iVar8 == 0) {
                iVar7 = -10;
              }
              iVar15 = 0;
              if (iVar8 == 0) {
                iVar15 = 10;
              }
              iVar8 = std::__cxx11::string::compare((char *)&local_1c0);
              uVar17 = local_150;
              uVar14 = uVar19 / 0x28;
              if (iVar8 != 0) {
                uVar14 = 0;
              }
              if (uVar19 != 0) {
                uVar11 = 0;
                uVar13 = 0;
                do {
                  iVar8 = (uint)*(byte *)(lVar18 + uVar11) - (uint)*(byte *)(lVar10 + uVar11);
                  uVar13 = uVar13 + (iVar8 < iVar7 || iVar15 < iVar8);
                  uVar11 = uVar11 + 1;
                } while (uVar19 != uVar11);
                if (uVar14 < uVar13) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"page ",5);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar9,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar9,(char *)local_1c0,(long)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,": mismatches: ",0xe);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," of ",4);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                  std::ostream::put((char)poVar9);
                  bVar6 = true;
                  std::ostream::flush();
                }
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"page ",5);
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,": image data length mismatch",0x1c);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              bVar6 = true;
              std::ostream::flush();
            }
            if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
            }
            Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&local_228);
            if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
            }
            if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
            }
          }
          if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
          }
          if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
          }
          if (local_1c0 != local_1b0) {
            operator_delete(local_1c0,local_1b0[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          lVar16 = lVar16 + 1;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
          ::~_Rb_tree(local_60);
          local_98 = (string *)((long)&local_1a0[1].field_2 + 8);
        } while (local_98 != local_d8);
        if (bVar6) {
          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar12,"errors found");
          __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"all checks passed",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_98);
      QPDF::~QPDF(local_1c8);
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_168);
      if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
      }
      QPDF::~QPDF(local_1f0);
      return 0;
    }
  }
  else {
    usage();
  }
  plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar12,"incorrect number of pages");
  __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 2) {
        usage();
    }
    char const* filename = argv[1];

    try {
        create_pdf(filename);
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}